

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

int __thiscall
semver::detail::prerelease_comparator::compare_identifier
          (prerelease_comparator *this,prerelease_identifier *lhs,prerelease_identifier *rhs)

{
  prerelease_identifier_type pVar1;
  int iVar2;
  string_view lhs_00;
  string_view lhs_01;
  string_view rhs_00;
  string_view rhs_01;
  
  pVar1 = lhs->type;
  if (pVar1 == numeric && rhs->type == numeric) {
    lhs_00._M_str = (lhs->identifier)._M_dataplus._M_p;
    lhs_00._M_len = (lhs->identifier)._M_string_length;
    rhs_00._M_str = (rhs->identifier)._M_dataplus._M_p;
    rhs_00._M_len = (rhs->identifier)._M_string_length;
    iVar2 = compare_numerically(lhs_00,rhs_00);
    return iVar2;
  }
  if (rhs->type == alphanumeric && pVar1 == alphanumeric) {
    lhs_01._M_str = (lhs->identifier)._M_dataplus._M_p;
    lhs_01._M_len = (lhs->identifier)._M_string_length;
    rhs_01._M_str = (rhs->identifier)._M_dataplus._M_p;
    rhs_01._M_len = (rhs->identifier)._M_string_length;
    iVar2 = compare(lhs_01,rhs_01);
    return iVar2;
  }
  return (uint)(pVar1 == alphanumeric) * 2 + -1;
}

Assistant:

[[nodiscard]] SEMVER_CONSTEXPR int compare_identifier(const prerelease_identifier& lhs, const prerelease_identifier& rhs) const noexcept {
    if (lhs.type == prerelease_identifier_type::numeric && rhs.type == prerelease_identifier_type::numeric) {
      return compare_numerically(lhs.identifier, rhs.identifier);
    } else if (lhs.type == prerelease_identifier_type::alphanumeric && rhs.type == prerelease_identifier_type::alphanumeric) {
      return detail::compare(lhs.identifier, rhs.identifier);
    }

    return lhs.type == prerelease_identifier_type::alphanumeric ? 1 : -1;
  }